

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall spdlog::pattern_formatter::compile_pattern_(pattern_formatter *this,string *pattern)

{
  pointer puVar1;
  flag_formatter *pfVar2;
  aggregate_formatter *paVar3;
  pointer __p_1;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  pointer puVar9;
  byte *pbVar10;
  pointer *__ptr;
  pointer puVar11;
  byte *pbVar12;
  byte *pbVar13;
  padding_info padding;
  padding_info padding_00;
  aggregate_formatter *local_50;
  _Head_base<0UL,_spdlog::details::flag_formatter_*,_false> local_48;
  _func_int **local_40;
  ulong local_38;
  
  pbVar13 = (byte *)(pattern->_M_dataplus)._M_p;
  pbVar10 = pbVar13 + pattern->_M_string_length;
  local_50 = (aggregate_formatter *)0x0;
  puVar9 = (this->formatters_).
           super__Vector_base<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->formatters_).
           super__Vector_base<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar11 = puVar9;
  if (puVar1 != puVar9) {
    do {
      pfVar2 = (puVar11->_M_t).
               super___uniq_ptr_impl<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
               ._M_t.
               super__Tuple_impl<0UL,_spdlog::details::flag_formatter_*,_std::default_delete<spdlog::details::flag_formatter>_>
               .super__Head_base<0UL,_spdlog::details::flag_formatter_*,_false>._M_head_impl;
      if (pfVar2 != (flag_formatter *)0x0) {
        (*pfVar2->_vptr_flag_formatter[1])();
      }
      (puVar11->_M_t).
      super___uniq_ptr_impl<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ._M_t.
      super__Tuple_impl<0UL,_spdlog::details::flag_formatter_*,_std::default_delete<spdlog::details::flag_formatter>_>
      .super__Head_base<0UL,_spdlog::details::flag_formatter_*,_false>._M_head_impl =
           (flag_formatter *)0x0;
      puVar11 = puVar11 + 1;
    } while (puVar11 != puVar1);
    (this->formatters_).
    super__Vector_base<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar9;
    pbVar13 = (byte *)(pattern->_M_dataplus)._M_p;
  }
  if (pbVar13 != pbVar10) {
    local_38 = 0x10000000001;
    local_40 = (_func_int **)&PTR__aggregate_formatter_0044ca20;
    do {
      paVar3 = local_50;
      if (*pbVar13 == 0x25) {
        if (local_50 != (aggregate_formatter *)0x0) {
          local_50 = (aggregate_formatter *)0x0;
          local_48._M_head_impl = &paVar3->super_flag_formatter;
          std::
          vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
          ::
          emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
                    ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                      *)&this->formatters_,
                     (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                      *)&local_48);
          if (local_48._M_head_impl != (flag_formatter *)0x0) {
            (*(local_48._M_head_impl)->_vptr_flag_formatter[1])();
          }
        }
        pbVar12 = pbVar13 + 1;
        if (pbVar12 == pbVar10) {
LAB_0022e5f9:
          uVar6 = 0;
          uVar5 = 0;
        }
        else {
          uVar4 = local_38;
          if (*pbVar12 == 0x2d) {
LAB_0022e516:
            pbVar12 = pbVar13 + 2;
          }
          else {
            uVar4 = 0x10000000000;
            if (*pbVar12 == 0x3d) {
              uVar4 = 0x10000000002;
              goto LAB_0022e516;
            }
          }
          if ((pbVar12 == pbVar10) || (9 < *pbVar12 - 0x30)) goto LAB_0022e5f9;
          uVar5 = (long)(char)*pbVar12 - 0x30;
          pbVar13 = pbVar12 + 1;
          if (pbVar13 == pbVar10) {
LAB_0022e649:
            uVar6 = 0;
          }
          else {
            bVar7 = *pbVar13;
            uVar8 = (uint)bVar7;
            if (uVar8 - 0x30 < 10) {
              pbVar12 = pbVar12 + 2;
              do {
                pbVar13 = pbVar12;
                uVar5 = ((long)(char)uVar8 + uVar5 * 10) - 0x30;
                if (pbVar13 == pbVar10) goto LAB_0022e649;
                bVar7 = *pbVar13;
                uVar8 = (uint)bVar7;
                pbVar12 = pbVar13 + 1;
              } while (uVar8 - 0x30 < 10);
              pbVar12 = pbVar13 + -1;
            }
            if (bVar7 == 0x21) {
              pbVar13 = pbVar12 + 2;
            }
            uVar6 = (ulong)(bVar7 == 0x21) << 0x20;
          }
          if (0x3f < uVar5) {
            uVar5 = 0x40;
          }
          uVar6 = uVar6 | uVar4;
          pbVar12 = pbVar13;
        }
        if (pbVar12 == pbVar10) break;
        puVar9 = (pointer)((ulong)puVar9 & 0xffff000000000000 | uVar6);
        pbVar13 = pbVar12;
        if ((uVar6 & 0x10000000000) == 0) {
          padding._8_8_ = puVar9;
          padding.width_ = uVar5;
          handle_flag_<spdlog::details::null_scoped_padder>(this,*pbVar12,padding);
        }
        else {
          padding_00._8_8_ = puVar9;
          padding_00.width_ = uVar5;
          handle_flag_<spdlog::details::scoped_padder>(this,*pbVar12,padding_00);
        }
      }
      else {
        if (local_50 == (aggregate_formatter *)0x0) {
          local_50 = (aggregate_formatter *)operator_new(0x38);
          ((flag_formatter *)local_50)->_vptr_flag_formatter = (_func_int **)0x0;
          (((flag_formatter *)local_50)->padinfo_).width_ = 0;
          (((flag_formatter *)local_50)->padinfo_).side_ = left;
          (((flag_formatter *)local_50)->padinfo_).truncate_ = false;
          (((flag_formatter *)local_50)->padinfo_).enabled_ = false;
          *(undefined2 *)&(((flag_formatter *)local_50)->padinfo_).field_0xe = 0;
          ((flag_formatter *)((long)local_50 + 0x18))->_vptr_flag_formatter = (_func_int **)0x0;
          (((flag_formatter *)((long)local_50 + 0x18))->padinfo_).width_ = 0;
          (((flag_formatter *)((long)local_50 + 0x18))->padinfo_).side_ = left;
          (((flag_formatter *)((long)local_50 + 0x18))->padinfo_).truncate_ = false;
          (((flag_formatter *)((long)local_50 + 0x18))->padinfo_).enabled_ = false;
          *(undefined2 *)&(((flag_formatter *)((long)local_50 + 0x18))->padinfo_).field_0xe = 0;
          ((flag_formatter *)((long)local_50 + 0x30))->_vptr_flag_formatter = (_func_int **)0x0;
          ((flag_formatter *)local_50)->_vptr_flag_formatter = local_40;
          ((flag_formatter *)((long)local_50 + 0x18))->_vptr_flag_formatter =
               (_func_int **)&(((flag_formatter *)((long)local_50 + 0x18))->padinfo_).side_;
        }
        std::__cxx11::string::push_back((char)local_50 + '\x18');
      }
      pbVar13 = pbVar13 + 1;
    } while (pbVar13 != pbVar10);
    local_48._M_head_impl = &local_50->super_flag_formatter;
    if (local_50 != (aggregate_formatter *)0x0) {
      local_50 = (aggregate_formatter *)0x0;
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
      ::
      emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
                ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                  *)&this->formatters_,
                 (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                  *)&local_48);
      if (local_48._M_head_impl != (flag_formatter *)0x0) {
        (*(local_48._M_head_impl)->_vptr_flag_formatter[1])();
      }
      if (local_50 != (aggregate_formatter *)0x0) {
        std::default_delete<spdlog::details::aggregate_formatter>::operator()
                  ((default_delete<spdlog::details::aggregate_formatter> *)&local_50,local_50);
      }
    }
  }
  return;
}

Assistant:

SPDLOG_INLINE void pattern_formatter::compile_pattern_(const std::string &pattern) {
    auto end = pattern.end();
    std::unique_ptr<details::aggregate_formatter> user_chars;
    formatters_.clear();
    for (auto it = pattern.begin(); it != end; ++it) {
        if (*it == '%') {
            if (user_chars)  // append user chars found so far
            {
                formatters_.push_back(std::move(user_chars));
            }

            auto padding = handle_padspec_(++it, end);

            if (it != end) {
                if (padding.enabled()) {
                    handle_flag_<details::scoped_padder>(*it, padding);
                } else {
                    handle_flag_<details::null_scoped_padder>(*it, padding);
                }
            } else {
                break;
            }
        } else  // chars not following the % sign should be displayed as is
        {
            if (!user_chars) {
                user_chars = details::make_unique<details::aggregate_formatter>();
            }
            user_chars->add_ch(*it);
        }
    }
    if (user_chars)  // append raw chars found so far
    {
        formatters_.push_back(std::move(user_chars));
    }
}